

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

void target_add_ret_ops(c2m_ctx_t c2m_ctx,type *ret_type,op_t res)

{
  int64_t *piVar1;
  ulong uVar2;
  anon_union_32_12_57d33f68_for_u *paVar3;
  MIR_type_t type;
  MIR_context_t pMVar4;
  gen_ctx_conflict *pgVar5;
  node_t_conflict pnVar6;
  long lVar7;
  MIR_item_t pMVar8;
  undefined8 uVar9;
  int64_t iVar10;
  char *pcVar11;
  undefined8 uVar12;
  MIR_disp_t MVar13;
  op_t var;
  uint uVar14;
  MIR_reg_t base;
  MIR_insn_t_conflict pMVar15;
  void *pvVar16;
  long lVar17;
  mir_size_t size;
  MIR_op_t *pMVar18;
  size_t sVar19;
  char *pcVar20;
  ulong uVar21;
  DLIST_LINK_MIR_item_t *pDVar22;
  MIR_type_t t;
  VARR_MIR_op_t *pVVar23;
  type *ptVar24;
  MIR_insn_t_conflict pMVar25;
  anon_union_32_12_57d33f68_for_u *paVar26;
  MIR_insn_code_t code;
  decl_t *unaff_R13;
  size_t sVar27;
  MIR_type_t *qword_types_00;
  op_t temp;
  MIR_type_t qword_types [2];
  int iStackY_214;
  MIR_insn_t_conflict pMStackY_210;
  type *ptStackY_208;
  decl_t *ppdStackY_200;
  anon_union_32_12_57d33f68_for_u *paStackY_1f8;
  MIR_op_t *pMStackY_1f0;
  code *pcStackY_1e8;
  VARR_MIR_op_t *pVStackY_1e0;
  MIR_context_t pMStackY_1d8;
  code *pcStackY_1d0;
  undefined1 local_128 [16];
  decl_t pdStack_118;
  char *pcStack_110;
  anon_union_32_12_57d33f68_for_u aStack_108;
  decl_t local_e8;
  decl_t pdStack_e0;
  decl_t pdStack_d8;
  char *pcStack_d0;
  decl_t pdStack_c8;
  char *pcStack_c0;
  decl_t pdStack_b8;
  char *pcStack_b0;
  MIR_type_t local_a0 [2];
  MIR_op_t local_98;
  undefined1 local_68 [16];
  anon_union_32_12_57d33f68_for_u aStack_58;
  
  pMVar4 = c2m_ctx->ctx;
  pgVar5 = c2m_ctx->gen_ctx;
  if ((ret_type->mode == TM_BASIC) && ((ret_type->u).basic_type == TP_VOID)) {
    return;
  }
  qword_types_00 = local_a0;
  pcStackY_1d0 = (code *)0x1abc84;
  pMVar25 = (MIR_insn_t_conflict)ret_type;
  uVar14 = process_ret_type(c2m_ctx,ret_type,qword_types_00);
  if (uVar14 == 0) {
    if ((ret_type->mode & ~TM_BASIC) == TM_STRUCT) {
      pcStackY_1d0 = (code *)0x1abe9c;
      base = MIR_reg(pMVar4,"Ret_Addr",(pgVar5->curr_func->u).func);
      pcStackY_1d0 = (code *)0x1abec0;
      MIR_new_mem_op((MIR_op_t *)local_68,pMVar4,MIR_T_I8,0,base,0,'\x01');
      aStack_108._8_8_ = aStack_58._16_8_;
      aStack_108._16_8_ = aStack_58.mem.disp;
      local_128._8_8_ = local_68._0_8_;
      pdStack_118 = (decl_t)local_68._8_8_;
      pcStack_110 = (char *)aStack_58.i;
      aStack_108.i = aStack_58._8_8_;
      local_e8 = (decl_t)0x0;
      pdStack_e0 = (decl_t)local_128._0_8_;
      pdStack_d8 = (decl_t)local_68._0_8_;
      pcStack_d0 = (char *)local_68._8_8_;
      pdStack_c8 = (decl_t)aStack_58.i;
      pcStack_c0 = aStack_58.str.s;
      pdStack_b8 = (decl_t)aStack_58._16_8_;
      pcStack_b0 = (char *)aStack_58.mem.disp;
      pcStackY_1d0 = (code *)0x1abf20;
      size = raw_type_size(c2m_ctx,ret_type);
      uVar21 = (ulong)ret_type->align;
      if (uVar21 != 0) {
        uVar2 = (size - 1) + uVar21;
        size = uVar2 - uVar2 % uVar21;
      }
      pcStackY_1d0 = (code *)0x1abf75;
      var._8_8_ = pdStack_e0;
      var.decl = local_e8;
      var.mir_op.data = pdStack_d8;
      var.mir_op._8_8_ = pcStack_d0;
      var.mir_op.u.i = (int64_t)pdStack_c8;
      var.mir_op.u.str.s = pcStack_c0;
      var.mir_op.u._16_8_ = pdStack_b8;
      var.mir_op.u.mem.disp = (MIR_disp_t)pcStack_b0;
      block_move(c2m_ctx,var,res,size);
      return;
    }
    pVVar23 = pgVar5->ret_ops;
    pdStack_d8 = res.mir_op.u._0_8_;
    pdStack_c8 = res.mir_op.u._16_8_;
    pcStack_c0 = (char *)res.mir_op.u.mem.disp;
    local_e8 = (decl_t)res.mir_op.data;
    pdStack_e0 = (decl_t)res.mir_op._8_8_;
    pcStack_d0 = res.mir_op.u.str.s;
    pMVar18 = pVVar23->varr;
    if (pMVar18 != (MIR_op_t *)0x0) {
      uVar21 = pVVar23->els_num + 1;
      if (pVVar23->size < uVar21) {
        sVar27 = (uVar21 >> 1) + uVar21;
        pcStackY_1d0 = (code *)0x1abfe2;
        pMVar18 = (MIR_op_t *)realloc(pMVar18,sVar27 * 0x30);
        pVVar23->varr = pMVar18;
        pVVar23->size = sVar27;
      }
      sVar27 = pVVar23->els_num;
      pMVar18 = pVVar23->varr;
      pVVar23->els_num = sVar27 + 1;
      paVar3 = &pMVar18[sVar27].u;
      paVar3->i = (int64_t)pdStack_d8;
      (&paVar3->i)[1] = (int64_t)pcStack_d0;
      (&paVar3->i)[2] = (int64_t)pdStack_c8;
      (&paVar3->i)[3] = (int64_t)pcStack_c0;
      pMVar18 = pMVar18 + sVar27;
      pMVar18->data = local_e8;
      *(decl_t *)&pMVar18->field_0x8 = pdStack_e0;
      (pMVar18->u).i = (int64_t)pdStack_d8;
      (pMVar18->u).str.s = pcStack_d0;
      return;
    }
  }
  else {
    if ((int)uVar14 < 1) {
      return;
    }
    unaff_R13 = &pdStack_d8;
    pVVar23 = (VARR_MIR_op_t *)0x0;
    while( true ) {
      type = *qword_types_00;
      t = type;
      if ((type & ~MIR_T_I16) == MIR_T_U8) {
        t = MIR_T_U32;
      }
      if ((type & ~MIR_T_I16) == MIR_T_I8) {
        t = MIR_T_I32;
      }
      pcStackY_1d0 = (code *)0x1abce1;
      get_new_temp((op_t *)local_128,c2m_ctx,t);
      local_e8 = (decl_t)local_128._0_8_;
      pdStack_e0 = (decl_t)local_128._8_8_;
      pdStack_d8 = pdStack_118;
      pcStack_d0 = pcStack_110;
      pdStack_c8 = (decl_t)aStack_108.i;
      pcStack_c0 = aStack_108.str.s;
      pdStack_b8 = (decl_t)aStack_108._16_8_;
      pcStack_b0 = (char *)aStack_108.mem.disp;
      if (type == MIR_T_F) {
        code = MIR_FMOV;
      }
      else if (type == MIR_T_D) {
        code = MIR_DMOV;
      }
      else {
        code = (uint)(type == MIR_T_LD) * 3;
      }
      pcStackY_1d0 = (code *)0x1abd50;
      MIR_new_mem_op(&local_98,pMVar4,type,(long)&pVVar23->els_num + res.mir_op.u.mem.disp,
                     res.mir_op.u.mem.base,res.mir_op.u.mem.index,res.mir_op.u.mem.scale);
      pcStackY_1d0 = (code *)0x1abd95;
      pMVar15 = MIR_new_insn(pMVar4,code);
      pMVar25 = (MIR_insn_t_conflict)pgVar5->curr_func;
      pcStackY_1d0 = (code *)0x1abdb0;
      MIR_append_insn(pMVar4,(MIR_item_t_conflict)pMVar25,pMVar15);
      ret_type = (type *)pgVar5->ret_ops;
      aStack_108.i = (int64_t)pdStack_b8;
      aStack_108.str.s = pcStack_b0;
      local_128._0_8_ = pdStack_d8;
      local_128._8_8_ = pcStack_d0;
      pdStack_118 = pdStack_c8;
      pcStack_110 = pcStack_c0;
      pMVar18 = *(MIR_op_t **)&ret_type->antialias;
      if (pMVar18 == (MIR_op_t *)0x0) break;
      ptVar24 = (type *)((long)&ret_type->pos_node->code + 1);
      if (ret_type->arr_type < ptVar24) {
        ptVar24 = (type *)((long)&ptVar24->pos_node + ((ulong)ptVar24 >> 1));
        pcStackY_1d0 = (code *)0x1abe0e;
        pvVar16 = realloc(pMVar18,(long)ptVar24 * 0x30);
        *(void **)&ret_type->antialias = pvVar16;
        ret_type->arr_type = ptVar24;
      }
      pnVar6 = ret_type->pos_node;
      lVar7 = *(long *)&ret_type->antialias;
      ret_type->pos_node = (node_t_conflict)((long)&pnVar6->code + 1);
      lVar17 = (long)pnVar6 * 0x30;
      piVar1 = (int64_t *)(lVar7 + 0x10 + lVar17);
      *piVar1 = (int64_t)pdStack_118;
      piVar1[1] = (int64_t)pcStack_110;
      piVar1[2] = aStack_108.i;
      piVar1[3] = (int64_t)aStack_108.str.s;
      piVar1 = (int64_t *)(lVar7 + lVar17);
      *piVar1 = local_128._0_8_;
      piVar1[1] = local_128._8_8_;
      piVar1[2] = (int64_t)pdStack_118;
      piVar1[3] = (int64_t)pcStack_110;
      qword_types_00 = qword_types_00 + 1;
      pVVar23 = (VARR_MIR_op_t *)&pVVar23->size;
      if ((VARR_MIR_op_t *)((ulong)uVar14 << 3) == pVVar23) {
        return;
      }
    }
    pcStackY_1d0 = (code *)0x1ac03a;
    target_add_ret_ops_cold_1();
  }
  pcStackY_1d0 = move_item_to_module_start;
  target_add_ret_ops_cold_2();
  paVar3 = &pMVar18->u;
  pcStackY_1e8 = (code *)0x1ac059;
  pMVar15 = pMVar25;
  paVar26 = paVar3;
  pVStackY_1e0 = pVVar23;
  pMStackY_1d8 = pMVar4;
  pcStackY_1d0 = (code *)qword_types_00;
  DLIST_MIR_item_t_remove((DLIST_MIR_item_t *)&paVar3->str,(MIR_item_t)pMVar25);
  if (pMVar25 == (MIR_insn_t_conflict)0x0) {
    pcStackY_1e8 = (code *)0x1ac09b;
    move_item_to_module_start_cold_3();
LAB_001ac09b:
    pcStackY_1e8 = (code *)0x1ac0a0;
    move_item_to_module_start_cold_1();
  }
  else {
    pMVar8 = (MIR_item_t)(paVar3->str).len;
    if (pMVar8 != (MIR_item_t)0x0) {
      if ((pMVar8->item_link).prev == (MIR_item_t)0x0) {
        pDVar22 = &pMVar8->item_link;
        goto LAB_001ac07e;
      }
      goto LAB_001ac09b;
    }
    if ((pMVar18->u).str.s == (char *)0x0) {
      pDVar22 = (DLIST_LINK_MIR_item_t *)((long)&pMVar18->u + 8);
LAB_001ac07e:
      pDVar22->prev = (MIR_item_t)pMVar25;
      ((DLIST_LINK_MIR_item_t *)&(pMVar25->insn_link).next)->prev = (MIR_item_t)0x0;
      *(MIR_item_t *)&pMVar25->field_0x18 = pMVar8;
      (paVar3->str).len = (size_t)pMVar25;
      return;
    }
  }
  pcStackY_1e8 = DLIST_MIR_item_t_remove;
  move_item_to_module_start_cold_2();
  if ((paVar26 != (anon_union_32_12_57d33f68_for_u *)0x0) && (pMVar15 != (MIR_insn_t_conflict)0x0))
  {
    pMVar8 = ((DLIST_LINK_MIR_item_t *)&(pMVar15->insn_link).next)->prev;
    if (pMVar8 == (MIR_item_t)0x0) {
      if ((MIR_insn_t_conflict)(paVar26->str).len != pMVar15) goto LAB_001ac101;
      (paVar26->str).len = (size_t)*(MIR_item_t *)&pMVar15->field_0x18;
    }
    else {
      (pMVar8->item_link).next = *(MIR_item_t *)&pMVar15->field_0x18;
    }
    if (*(MIR_item_t *)&pMVar15->field_0x18 == (MIR_item_t)0x0) {
      if ((MIR_insn_t_conflict)(paVar26->str).s != pMVar15) goto LAB_001ac106;
      pDVar22 = (DLIST_LINK_MIR_item_t *)((long)paVar26 + 8);
    }
    else {
      pDVar22 = &(*(MIR_item_t *)&pMVar15->field_0x18)->item_link;
    }
    pDVar22->prev = pMVar8;
    ((DLIST_LINK_MIR_item_t *)&(pMVar15->insn_link).next)->prev = (MIR_item_t)0x0;
    *(MIR_item_t *)&pMVar15->field_0x18 = (MIR_item_t)0x0;
    return;
  }
  pMStackY_1f0 = (MIR_op_t *)0x1ac101;
  DLIST_MIR_item_t_remove_cold_1();
LAB_001ac101:
  pMStackY_1f0 = (MIR_op_t *)0x1ac106;
  DLIST_MIR_item_t_remove_cold_2();
LAB_001ac106:
  pMStackY_1f0 = (MIR_op_t *)emit_insn_opt;
  DLIST_MIR_item_t_remove_cold_3();
  pMVar4 = (MIR_context_t)paVar26->ref;
  sVar27 = (&paVar26->str)[0x20].len;
  pMStackY_210 = pMVar25;
  ptStackY_208 = ret_type;
  ppdStackY_200 = unaff_R13;
  paStackY_1f8 = paVar3;
  pMStackY_1f0 = pMVar18;
  if (((((((*(uint *)&pMVar15->field_0x18 & 0xfffffffc) == 0) &&
         (pMVar25 = *(MIR_insn_t_conflict *)(*(long *)(*(long *)(sVar27 + 0xc0) + 0x40) + 0x20),
         pMVar25 != (MIR_insn_t_conflict)0x0)) &&
        (sVar19 = MIR_insn_nops(pMVar4,pMVar25), sVar19 != 0)) &&
       ((*(char *)&pMVar15[1].insn_link.prev == '\x01' &&
        (pcVar20 = MIR_reg_name((MIR_context_t)(paVar26->str).len,
                                *(MIR_reg_t *)&pMVar15[1].insn_link.next,
                                *(MIR_func_t *)(*(long *)((&paVar26->str)[0x20].len + 0xc0) + 0x40))
        , pcVar20[1] == '_')))) &&
      ((pMVar15->ops[0].field_0x8 != '\x01' ||
       (pcVar20 = MIR_reg_name((MIR_context_t)(paVar26->str).len,pMVar15->ops[0].u.reg,
                               *(MIR_func_t *)(*(long *)((&paVar26->str)[0x20].len + 0xc0) + 0x40)),
       pcVar20[1] != '_')))) &&
     ((((pMVar25->ops[0].field_0x8 == '\x01' &&
        (pcVar20 = MIR_reg_name((MIR_context_t)(paVar26->str).len,pMVar25->ops[0].u.reg,
                                *(MIR_func_t *)(*(long *)((&paVar26->str)[0x20].len + 0xc0) + 0x40))
        , pcVar20[1] == '_')) && (*(MIR_reg_t *)&pMVar15[1].insn_link.next == pMVar25->ops[0].u.reg)
       ) && (MIR_insn_op_mode(pMVar4,pMVar25,0,&iStackY_214), iStackY_214 != 0)))) {
    pvVar16 = pMVar15->ops[0].data;
    uVar9 = *(undefined8 *)&pMVar15->ops[0].field_0x8;
    iVar10 = pMVar15->ops[0].u.i;
    pcVar20 = pMVar15->ops[0].u.str.s;
    pcVar11 = pMVar15->ops[0].u.str.s;
    uVar12 = *(undefined8 *)((long)&pMVar15->ops[0].u + 0x10);
    MVar13 = pMVar15->ops[0].u.mem.disp;
    pMVar25->ops[0].u.i = pMVar15->ops[0].u.i;
    pMVar25->ops[0].u.str.s = pcVar11;
    *(undefined8 *)((long)&pMVar25->ops[0].u + 0x10) = uVar12;
    pMVar25->ops[0].u.mem.disp = MVar13;
    pMVar25->ops[0].data = pvVar16;
    *(undefined8 *)&pMVar25->ops[0].field_0x8 = uVar9;
    pMVar25->ops[0].u.i = iVar10;
    pMVar25->ops[0].u.str.s = pcVar20;
    MIR_append_insn(pMVar4,*(MIR_item_t_conflict *)(sVar27 + 0xc0),pMVar15);
    MIR_remove_insn(pMVar4,*(MIR_item_t_conflict *)(sVar27 + 0xc0),pMVar15);
  }
  else {
    MIR_append_insn(pMVar4,*(MIR_item_t_conflict *)(sVar27 + 0xc0),pMVar15);
  }
  return;
}

Assistant:

static void target_add_ret_ops (c2m_ctx_t c2m_ctx, struct type *ret_type, op_t res) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  MIR_insn_t insn;
  MIR_reg_t ret_addr_reg;
  op_t temp, var;
  int i, n_qwords;

  if (void_type_p (ret_type)) return;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      type = qword_types[i];
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (type));
      insn = MIR_new_insn (ctx, tp_mov (type), temp.mir_op,
                           MIR_new_mem_op (ctx, type, res.mir_op.u.mem.disp + 8 * i,
                                           res.mir_op.u.mem.base, res.mir_op.u.mem.index,
                                           res.mir_op.u.mem.scale));
      MIR_append_insn (ctx, curr_func, insn);
      VARR_PUSH (MIR_op_t, ret_ops, temp.mir_op);
    }
  } else if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) {
    VARR_PUSH (MIR_op_t, ret_ops, res.mir_op);
  } else {
    ret_addr_reg = MIR_reg (ctx, RET_ADDR_NAME, curr_func->u.func);
    var = new_op (NULL, MIR_new_mem_op (ctx, MIR_T_I8, 0, ret_addr_reg, 0, 1));
    block_move (c2m_ctx, var, res, type_size (c2m_ctx, ret_type));
  }
}